

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_node_struct * __thiscall pugi::xml_text::_data(xml_text *this)

{
  xml_node_struct *pxVar1;
  uint uVar2;
  
  pxVar1 = this->_root;
  if (((pxVar1 != (xml_node_struct *)0x0) && (uVar2 = (uint)pxVar1->header, 1 < (uVar2 & 0xf) - 3))
     && (((uVar2 & 0xf) != 2 || (pxVar1->value == (char_t *)0x0)))) {
    pxVar1 = pxVar1->first_child;
    while ((pxVar1 != (xml_node_struct *)0x0 && (1 < ((uint)pxVar1->header & 0xf) - 3))) {
      pxVar1 = pxVar1->next_sibling;
    }
  }
  return pxVar1;
}

Assistant:

PUGI_IMPL_FN xml_node_struct* xml_text::_data() const
	{
		if (!_root || impl::is_text_node(_root)) return _root;

		// element nodes can have value if parse_embed_pcdata was used
		if (PUGI_IMPL_NODETYPE(_root) == node_element && _root->value)
			return _root;

		for (xml_node_struct* node = _root->first_child; node; node = node->next_sibling)
			if (impl::is_text_node(node))
				return node;

		return NULL;
	}